

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGGenerateAttributes(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr pxVar1;
  xmlRelaxNGDefinePtr local_38;
  xmlRelaxNGDefinePtr_conflict tmp;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict parent;
  xmlRelaxNGDefinePtr_conflict def_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  pxVar1 = def;
  if (ctxt->nbErrors == 0) {
LAB_001c91a2:
    tmp = pxVar1;
    if (tmp != (xmlRelaxNGDefinePtr_conflict)0x0) {
      if ((((tmp->type == XML_RELAXNG_ELEMENT) || (tmp->type == XML_RELAXNG_TEXT)) ||
          (tmp->type == XML_RELAXNG_DATATYPE)) ||
         (((tmp->type == XML_RELAXNG_PARAM || (tmp->type == XML_RELAXNG_LIST)) ||
          ((tmp->type == XML_RELAXNG_VALUE || (tmp->type == XML_RELAXNG_EMPTY)))))) {
        return 0;
      }
      if (((((tmp->type == XML_RELAXNG_CHOICE) || (tmp->type == XML_RELAXNG_INTERLEAVE)) ||
           ((tmp->type == XML_RELAXNG_GROUP ||
            ((((tmp->type == XML_RELAXNG_ONEORMORE || (tmp->type == XML_RELAXNG_ZEROORMORE)) ||
              (tmp->type == XML_RELAXNG_OPTIONAL)) ||
             ((tmp->type == XML_RELAXNG_PARENTREF || (tmp->type == XML_RELAXNG_EXTERNALREF))))))))
          || ((tmp->type == XML_RELAXNG_REF || (tmp->type == XML_RELAXNG_DEF)))) &&
         (tmp->content != (xmlRelaxNGDefinePtr)0x0)) {
        pxVar1 = tmp->content;
        for (local_38 = pxVar1; local_38 != (xmlRelaxNGDefinePtr)0x0; local_38 = local_38->next) {
          local_38->parent = tmp;
        }
      }
      else {
        if (tmp == def) goto LAB_001c931a;
        if (tmp->next == (xmlRelaxNGDefinePtr)0x0) {
          do {
            tmp = tmp->parent;
            pxVar1 = tmp;
            if (tmp == (xmlRelaxNGDefinePtr_conflict)0x0) break;
            if (tmp == def) {
              return 1;
            }
            if (tmp->next != (xmlRelaxNGDefinePtr)0x0) {
              pxVar1 = tmp->next;
              break;
            }
          } while (tmp != (xmlRelaxNGDefinePtr_conflict)0x0);
        }
        else {
          pxVar1 = tmp->next;
        }
      }
      goto LAB_001c91a2;
    }
LAB_001c931a:
    ctxt_local._4_4_ = 1;
  }
  else {
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGGenerateAttributes(xmlRelaxNGParserCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr parent, cur, tmp;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return (-1);

    parent = NULL;
    cur = def;
    while (cur != NULL) {
        if ((cur->type == XML_RELAXNG_ELEMENT) ||
            (cur->type == XML_RELAXNG_TEXT) ||
            (cur->type == XML_RELAXNG_DATATYPE) ||
            (cur->type == XML_RELAXNG_PARAM) ||
            (cur->type == XML_RELAXNG_LIST) ||
            (cur->type == XML_RELAXNG_VALUE) ||
            (cur->type == XML_RELAXNG_EMPTY))
            return (0);
        if ((cur->type == XML_RELAXNG_CHOICE) ||
            (cur->type == XML_RELAXNG_INTERLEAVE) ||
            (cur->type == XML_RELAXNG_GROUP) ||
            (cur->type == XML_RELAXNG_ONEORMORE) ||
            (cur->type == XML_RELAXNG_ZEROORMORE) ||
            (cur->type == XML_RELAXNG_OPTIONAL) ||
            (cur->type == XML_RELAXNG_PARENTREF) ||
            (cur->type == XML_RELAXNG_EXTERNALREF) ||
            (cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_DEF)) {
            if (cur->content != NULL) {
                parent = cur;
                cur = cur->content;
                tmp = cur;
                while (tmp != NULL) {
                    tmp->parent = parent;
                    tmp = tmp->next;
                }
                continue;
            }
        }
        if (cur == def)
            break;
        if (cur->next != NULL) {
            cur = cur->next;
            continue;
        }
        do {
            cur = cur->parent;
            if (cur == NULL)
                break;
            if (cur == def)
                return (1);
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
        } while (cur != NULL);
    }
    return (1);
}